

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

void __thiscall
cli::Parser::set_callback<bool>
          (Parser *this,string *name,string *alternative,
          function<bool_(cli::CallbackArgs_&)> *callback,string *description,bool dominant)

{
  CmdFunction<bool> *this_00;
  CmdFunction<bool> *local_38;
  
  this_00 = (CmdFunction<bool> *)operator_new(0xd8);
  CmdFunction<bool>::CmdFunction(this_00,name,alternative,description,false,dominant);
  std::function<bool_(cli::CallbackArgs_&)>::operator=(&this_00->callback,callback);
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>>::
  emplace_back<cli::Parser::CmdBase*>
            ((vector<cli::Parser::CmdBase*,std::allocator<cli::Parser::CmdBase*>> *)&this->_commands
             ,(CmdBase **)&local_38);
  return;
}

Assistant:

void set_callback(const std::string& name, const std::string& alternative, std::function<T(CallbackArgs&)> callback, const std::string& description = "", bool dominant = false) {
			auto command = new CmdFunction<T> { name, alternative, description, false, dominant };
			command->callback = callback;
			_commands.push_back(command);
		}